

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.h
# Opt level: O3

bool __thiscall
Potassco::ProgramOptions::
OptionOutputImpl<Potassco::ProgramOptions::OstreamWriter,_Potassco::ProgramOptions::DefaultFormat>::
printOption(OptionOutputImpl<Potassco::ProgramOptions::OstreamWriter,_Potassco::ProgramOptions::DefaultFormat>
            *this,Option *opt,size_t maxW)

{
  size_t sVar1;
  OptionOutputImpl<Potassco::ProgramOptions::OstreamWriter,_Potassco::ProgramOptions::DefaultFormat>
  *this_00;
  size_t in_R8;
  
  this_00 = this;
  sVar1 = DefaultFormat::format((DefaultFormat *)this,&this->buffer_,opt,maxW);
  if (sVar1 != 0) {
    this_00 = (OptionOutputImpl<Potassco::ProgramOptions::OstreamWriter,_Potassco::ProgramOptions::DefaultFormat>
               *)(this->writer_).out;
    std::ostream::write((char *)this_00,
                        (long)(this->buffer_).super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
  }
  sVar1 = DefaultFormat::format
                    ((DefaultFormat *)this_00,&this->buffer_,opt->description_,opt->value_,in_R8);
  if (sVar1 != 0) {
    std::ostream::write((char *)(this->writer_).out,
                        (long)(this->buffer_).super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool printOption(const Option& opt, std::size_t maxW) {
		writer_.write(buffer_, formatter_.format(buffer_, opt, maxW));
		writer_.write(buffer_, formatter_.format(buffer_, opt.description(), *opt.value(), maxW));
		return true;
	}